

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

void __thiscall Dice::resolveDuringHand(Dice *this)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  int keepNumber;
  string answer;
  string keep;
  string next;
  int local_ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>_>
  *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *local_60;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_50,"Y",(allocator *)&local_a8);
  iVar4 = this->numberOfRolls;
  if (iVar4 == 0) goto LAB_00105994;
  if (iVar4 == 1) {
    iVar4 = addToCount(this);
    if (iVar4 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "Selected None on 2nd role, forcing 3rd role and keeping");
      std::endl<char,std::char_traits<char>>(poVar5);
LAB_00105984:
      resetResolvedHand(this);
      setResolvedHandToDiceValues(this);
      goto LAB_00105994;
    }
    iVar4 = this->numberOfRolls;
  }
  if (iVar4 != 2) goto LAB_00105483;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "Do you want to throw your 1st roll keeps to select more dice on 3rd roll? (Y or N)"
                          );
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator>>((istream *)&std::cin,(string *)&local_a8);
  bVar3 = std::operator==(&local_a8,"Y");
  if (bVar3) {
LAB_0010546b:
    resetResolvedHand(this);
  }
  else {
    bVar3 = std::operator==(&local_a8,"Yes");
    if (bVar3) goto LAB_0010546b;
    bVar3 = std::operator==(&local_a8,"y");
    if (bVar3) goto LAB_0010546b;
    iVar4 = addToCount(this);
    if (iVar4 == 6) {
      bVar3 = std::operator==(&local_a8,"N");
      if (!bVar3) {
        bVar3 = std::operator==(&local_a8,"n");
        if (!bVar3) {
          bVar3 = std::operator==(&local_a8,"NO");
          if (!bVar3) {
            bVar3 = std::operator==(&local_a8,"No");
            if (!bVar3) {
              bVar3 = std::operator==(&local_a8,"no");
              if (!bVar3) goto LAB_00105473;
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_a8);
LAB_00105994:
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_80);
      return;
    }
  }
LAB_00105473:
  std::__cxx11::string::~string((string *)&local_a8);
  iVar4 = this->numberOfRolls;
LAB_00105483:
  if (iVar4 == 1) {
    iVar4 = addToCount(this);
    if (iVar4 == 6) {
      std::__cxx11::string::assign((char *)&local_50);
    }
    if (this->numberOfRolls == 1) {
      showResolvedHand(this);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "You must select a total of 6 cards to resolve the hand");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  local_88 = &this->diceMap;
  local_58 = &this->DiceValues;
  local_60 = &this->resolvedHand;
LAB_001054fc:
  bVar3 = std::operator==(&local_50,"YES");
  if (!bVar3) {
    bVar3 = std::operator==(&local_50,"Y");
    if (!bVar3) goto LAB_00105994;
  }
  if (this->numberOfRolls == 1) {
LAB_0010568d:
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "Rest - Type: Rest , this will take the rest of roll 3 and add it to current resolved"
                            );
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "------------------------------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar5);
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
    poVar5 = std::operator<<((ostream *)&std::cout,"| ");
    poVar5 = std::operator<<(poVar5,"Which dice do you want to keep?");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "------------------------------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar5);
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
    poVar5 = std::operator<<((ostream *)&std::cout,"| ");
    poVar5 = std::operator<<(poVar5,"All - Type: All , this will discard roll 2 & 3");
    std::endl<char,std::char_traits<char>>(poVar5);
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
    poVar5 = std::operator<<((ostream *)&std::cout,"| ");
    poVar5 = std::operator<<(poVar5,"None - Type: None or N, this will force the next roll");
    std::endl<char,std::char_traits<char>>(poVar5);
    *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
    poVar5 = std::operator<<((ostream *)&std::cout,"| ");
    poVar5 = std::operator<<(poVar5,
                             "Some - Type first letter of type (Dice Type: Char) Ex= A for Attacks..."
                            );
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "------------------------------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar5);
    if (this->numberOfRolls == 1) goto LAB_0010568d;
  }
  std::operator>>((istream *)&std::cin,(string *)&local_80);
  sVar2 = local_80._M_string_length;
  _Var1._M_p = local_80._M_dataplus._M_p;
  for (sVar8 = 0; sVar2 != sVar8; sVar8 = sVar8 + 1) {
    iVar4 = toupper((int)_Var1._M_p[sVar8]);
    _Var1._M_p[sVar8] = (char)iVar4;
  }
  bVar3 = std::operator==(&local_80,"All");
  if (!bVar3) {
    bVar3 = std::operator==(&local_80,"ALL");
    if (bVar3) goto LAB_00105951;
    bVar3 = std::operator==(&local_80,"NONE");
    if (bVar3) {
LAB_0010593e:
      std::__cxx11::string::assign((char *)&local_50);
      goto LAB_00105994;
    }
    bVar3 = std::operator==(&local_80,"None");
    if (bVar3) goto LAB_0010593e;
    bVar3 = std::operator==(&local_80,"N");
    if (bVar3) goto LAB_0010593e;
    bVar3 = std::operator==(&local_80,"Rest");
    if (bVar3) {
LAB_00105781:
      if (this->numberOfRolls != 1) goto LAB_00105791;
LAB_0010581e:
      addDiceValuesToResolvedHand(this);
      goto LAB_0010582d;
    }
    bVar3 = std::operator==(&local_80,"rest");
    if (bVar3) goto LAB_00105781;
    bVar3 = std::operator==(&local_80,"REST");
    if ((bVar3) && (this->numberOfRolls == 1)) goto LAB_0010581e;
LAB_00105791:
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "How many of the selected dice do you want to keep? Ex= 2 for 2 Attacks  "
                            );
    std::endl<char,std::char_traits<char>>(poVar5);
    std::istream::operator>>((istream *)&std::cin,&local_ac);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>_>
             ::operator[](local_88,&local_80);
    pmVar7 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](local_58,pmVar6);
    iVar4 = local_ac;
    if (local_ac <= *pmVar7) {
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>_>
               ::operator[](local_88,&local_80);
      pmVar7 = std::
               map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
               ::operator[](local_60,pmVar6);
      *pmVar7 = *pmVar7 + iVar4;
      if (this->numberOfRolls == 1) {
        iVar4 = addToCount(this);
        if (iVar4 == 6) goto LAB_0010582d;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "Do you have another selection for dice you wish to keep? Y=Yes, N=No  "
                              );
      std::endl<char,std::char_traits<char>>(poVar5);
      std::operator>>((istream *)&std::cin,(string *)&local_50);
      sVar2 = local_50._M_string_length;
      _Var1._M_p = local_50._M_dataplus._M_p;
      for (sVar8 = 0; sVar2 != sVar8; sVar8 = sVar8 + 1) {
        iVar4 = toupper((int)_Var1._M_p[sVar8]);
        _Var1._M_p[sVar8] = (char)iVar4;
      }
      bVar3 = std::operator==(&local_50,"N");
      if (!bVar3) {
        bVar3 = std::operator==(&local_50,"NO");
        if (!bVar3) goto code_r0x001058f5;
      }
      goto LAB_00105994;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "You cannot select more than is currently available");
    std::endl<char,std::char_traits<char>>(poVar5);
    goto LAB_001054fc;
  }
LAB_00105951:
  if (this->numberOfRolls < 2) goto LAB_00105984;
  addDiceValuesToResolvedHand(this);
  goto LAB_00105994;
code_r0x001058f5:
  if (this->numberOfRolls == 1) {
    iVar4 = addToCount(this);
    if (iVar4 != 6) {
      showResolvedHand(this);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "You must select a total of 6 cards to finish with. Please select more cards"
                              );
      std::endl<char,std::char_traits<char>>(poVar5);
LAB_0010582d:
      std::__cxx11::string::assign((char *)&local_50);
    }
  }
  goto LAB_001054fc;
}

Assistant:

void Dice::resolveDuringHand() {
    string keep;
    int keepNumber;
    string next = "Y";

    if (this->getNumbOfRollsRemaining() == 0) {
        return;
    }
    if (this->getNumbOfRollsRemaining() == 1 && addToCount() == 0) {
        cout << "Selected None on 2nd role, forcing 3rd role and keeping" << endl;
        resetResolvedHand();
        setResolvedHandToDiceValues();
        return;
    }
    if (getNumbOfRollsRemaining() == 2) {
        string answer;
        cout << "Do you want to throw your 1st roll keeps to select more dice on 3rd roll? (Y or N)" << endl;
        cin >> answer;
        if (answer == "Y" || answer == "Yes" || answer == "y") {
            resetResolvedHand();
        }
        else if (addToCount()==6 && (answer == "N" || answer == "n" || answer == "NO" || answer == "No" || answer == "no")){
            return;
        }
    }

    if(getNumbOfRollsRemaining() == 1 && addToCount()==6) {
        next = "N";
    }

    if(getNumbOfRollsRemaining() == 1) {
        showResolvedHand();
        cout << "You must select a total of 6 cards to resolve the hand" << endl;
    }

    while (next == "YES" || next == "Y") {
        if(getNumbOfRollsRemaining() != 1) {
            cout << endl;
            cout << "------------------------------------------------------------------" << endl;
            cout << left << "| " << "Which dice do you want to keep?" << endl;
            cout << "------------------------------------------------------------------" << endl;
            cout << left << "| " << "All - Type: All , this will discard roll 2 & 3" << endl;
            cout << left << "| " << "None - Type: None or N, this will force the next roll" << endl;
            cout << left << "| " << "Some - Type first letter of type (Dice Type: Char) Ex= A for Attacks..." << endl;
            cout << "------------------------------------------------------------------" << endl;

        }

        if(getNumbOfRollsRemaining() == 1) {
            cout << "Rest - Type: Rest , this will take the rest of roll 3 and add it to current resolved" << endl;
        }
        cin >> keep;
        transform(keep.begin(), keep.end(), keep.begin(), ::toupper);
        if(keep == "All" || keep == "ALL") {
            if(getNumbOfRollsRemaining() > 1 ) {
                addDiceValuesToResolvedHand();
                break;
            }
            else{
                resetResolvedHand();
                setResolvedHandToDiceValues();
                break;
            }
        }

        if(keep == "NONE" || keep == "None" || keep == "N") {
            next = "N";
            break;
        }
        if ((keep == "Rest" || keep == "rest" || keep == "REST") && getNumbOfRollsRemaining() == 1)  {
            addDiceValuesToResolvedHand();
            next = "N";
            continue;
        }

        else {
            cout << "How many of the selected dice do you want to keep? Ex= 2 for 2 Attacks  " << endl;
            cin >> keepNumber;
            if(DiceValues[diceMap[keep]] < keepNumber)
            {
                cout << "You cannot select more than is currently available" << endl;
                continue;
            }
            resolvedHand[diceMap[keep]] += keepNumber;
            if(getNumbOfRollsRemaining() == 1 && addToCount()==6) {
                next = "N";
                continue;
            }
            cout << "Do you have another selection for dice you wish to keep? Y=Yes, N=No  " << endl;
            cin >> next;
            transform(next.begin(), next.end(), next.begin(), ::toupper);
            if(next == "N" || next == "NO"){
                return;
            }
            if (getNumbOfRollsRemaining() == 1 && addToCount()!=6){
            showResolvedHand();
            cout << "You must select a total of 6 cards to finish with. Please select more cards" << endl;
            next = "Y";
            continue;
            }
        }

    }
}